

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::BooleanColumnWriter::WriteVector
          (BooleanColumnWriter *this,WriteStream *temp_writer,ColumnWriterStatistics *stats_p,
          ColumnWriterPageState *state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  bool bVar1;
  uint8_t uVar2;
  BooleanStatisticsState *pBVar3;
  BooleanWriterPageState *pBVar4;
  TemplatedValidityMask<unsigned_long> *this_00;
  bool *pbVar5;
  TemplatedValidityMask<unsigned_long> *in_R9;
  bool *val_1;
  idx_t r_1;
  bool *val;
  idx_t r;
  bool *ptr;
  ValidityMask *mask;
  BooleanWriterPageState *state;
  BooleanStatisticsState *stats;
  uchar in_stack_ffffffffffffff8f;
  ColumnWriterPageState *in_stack_ffffffffffffff90;
  TemplatedValidityMask<unsigned_long> *local_58;
  
  pBVar3 = ColumnWriterStatistics::Cast<duckdb::BooleanStatisticsState>
                     ((ColumnWriterStatistics *)in_stack_ffffffffffffff90);
  pBVar4 = ColumnWriterPageState::Cast<duckdb::BooleanWriterPageState>(in_stack_ffffffffffffff90);
  this_00 = &FlatVector::Validity((Vector *)0x2401082)->super_TemplatedValidityMask<unsigned_long>;
  pbVar5 = FlatVector::GetData<bool>((Vector *)0x2401091);
  if ((((pBVar3->max & 1U) == 0) || ((pBVar3->min & 1U) != 0)) ||
     (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(this_00), local_58 = in_R9, !bVar1)) {
    for (; in_R9 < val_1;
        in_R9 = (TemplatedValidityMask<unsigned_long> *)((long)&in_R9->validity_mask + 1)) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_R9,(idx_t)in_stack_ffffffffffffff90);
      if (bVar1) {
        in_stack_ffffffffffffff90 = (ColumnWriterPageState *)(pbVar5 + (long)in_R9);
        pBVar3->max = (pBVar3->max & 1U) != 0 ||
                      ((ulong)in_stack_ffffffffffffff90->_vptr_ColumnWriterPageState & 1) != 0;
        pBVar3->min = (pBVar3->min & 1U &
                      *(byte *)&in_stack_ffffffffffffff90->_vptr_ColumnWriterPageState & 1) != 0;
        pBVar4->byte = pBVar4->byte |
                       (*(byte *)&in_stack_ffffffffffffff90->_vptr_ColumnWriterPageState & 1) <<
                       (pBVar4->byte_pos & 0x1f);
        uVar2 = pBVar4->byte_pos + '\x01';
        pBVar4->byte_pos = uVar2;
        if (uVar2 == '\b') {
          WriteStream::Write<unsigned_char>
                    ((WriteStream *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
          pBVar4->byte = '\0';
          pBVar4->byte_pos = '\0';
        }
      }
    }
  }
  else {
    for (; local_58 < val_1;
        local_58 = (TemplatedValidityMask<unsigned_long> *)((long)&local_58->validity_mask + 1)) {
      pBVar4->byte = pBVar4->byte | (pbVar5[(long)local_58] & 1U) << (pBVar4->byte_pos & 0x1f);
      uVar2 = pBVar4->byte_pos + '\x01';
      pBVar4->byte_pos = uVar2;
      if (uVar2 == '\b') {
        WriteStream::Write<unsigned_char>
                  ((WriteStream *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
        pBVar4->byte = '\0';
        pBVar4->byte_pos = '\0';
      }
    }
  }
  return;
}

Assistant:

void BooleanColumnWriter::WriteVector(WriteStream &temp_writer, ColumnWriterStatistics *stats_p,
                                      ColumnWriterPageState *state_p, Vector &input_column, idx_t chunk_start,
                                      idx_t chunk_end) {
	auto &stats = stats_p->Cast<BooleanStatisticsState>();
	auto &state = state_p->Cast<BooleanWriterPageState>();
	const auto &mask = FlatVector::Validity(input_column);

	const auto *const ptr = FlatVector::GetData<bool>(input_column);
	if (stats.max && !stats.min && mask.AllValid()) {
		// Fast path: stats have already been set, and there's no NULLs
		for (idx_t r = chunk_start; r < chunk_end; r++) {
			const auto &val = ptr[r];
			state.byte |= val << state.byte_pos;
			if (++state.byte_pos == 8) {
				temp_writer.Write(state.byte);
				state.byte = 0;
				state.byte_pos = 0;
			}
		}
	} else {
		for (idx_t r = chunk_start; r < chunk_end; r++) {
			if (!mask.RowIsValid(r)) {
				continue;
			}
			const auto &val = ptr[r];

			stats.max |= val;
			stats.min &= val;
			state.byte |= val << state.byte_pos;

			if (++state.byte_pos == 8) {
				temp_writer.Write(state.byte);
				state.byte = 0;
				state.byte_pos = 0;
			}
		}
	}
}